

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscep.c
# Opt level: O3

EVP_MD * get_digest_alg(char *arg,int ca_caps)

{
  int iVar1;
  EVP_MD *pEVar2;
  
  if (arg == (char *)0x0) {
    if (((uint)ca_caps >> 9 & 1) != 0) goto LAB_001076ce;
    if (((uint)ca_caps >> 8 & 1) != 0) {
LAB_001076d4:
      pEVar2 = EVP_sha384();
      return (EVP_MD *)pEVar2;
    }
    if ((ca_caps & 0x480U) != 0) {
LAB_001076c8:
      pEVar2 = EVP_sha256();
      return (EVP_MD *)pEVar2;
    }
    if ((ca_caps & 0x40U) != 0) goto LAB_001076f0;
    if ((ca_caps & 0x20U) != 0) goto LAB_001076ea;
  }
  else if (((*arg != 'm') || (arg[1] != 'd')) || (arg[2] != '5')) {
    iVar1 = strncmp(arg,"sha1",4);
    if (iVar1 == 0) {
LAB_001076ea:
      pEVar2 = EVP_sha1();
      return (EVP_MD *)pEVar2;
    }
    iVar1 = strncmp(arg,"sha224",6);
    if (iVar1 == 0) {
LAB_001076f0:
      pEVar2 = EVP_sha224();
      return (EVP_MD *)pEVar2;
    }
    iVar1 = strncmp(arg,"sha256",6);
    if (iVar1 == 0) goto LAB_001076c8;
    iVar1 = strncmp(arg,"sha384",6);
    if (iVar1 == 0) goto LAB_001076d4;
    iVar1 = strncmp(arg,"sha512",6);
    if (iVar1 != 0) {
      return (EVP_MD *)0x0;
    }
LAB_001076ce:
    pEVar2 = EVP_sha512();
    return (EVP_MD *)pEVar2;
  }
  pEVar2 = EVP_md5();
  return (EVP_MD *)pEVar2;
}

Assistant:

const EVP_MD *get_digest_alg(const char *arg, int ca_caps)
{
	if (!arg) {
		if (SUP_CAP_SHA_512(ca_caps))
			return EVP_sha512();
		else if (SUP_CAP_SHA_384(ca_caps))
			return EVP_sha384();
		else if (SUP_CAP_SHA_256(ca_caps))
			return EVP_sha256();
		else if (SUP_CAP_SHA_224(ca_caps))
			return EVP_sha224();
		else if (SUP_CAP_SHA_1(ca_caps))
			return EVP_sha1();
		else
			return EVP_md5();
	} else if (!strncmp(arg, "md5", 3)) {
		return EVP_md5();
	} else if (!strncmp(arg, "sha1", 4)) {
		return EVP_sha1();
	} else if (!strncmp(arg, "sha224", 6)) {
		return EVP_sha224();
	} else if (!strncmp(arg, "sha256", 6)) {
		return EVP_sha256();
	} else if (!strncmp(arg, "sha384", 6)) {
		return EVP_sha384();
	} else if (!strncmp(arg, "sha512", 6)) {
		return EVP_sha512();
	} else {
		return NULL;
	}
}